

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferGLImpl::BufferGLImpl
          (BufferGLImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceGLImpl *pDeviceGL,
          BufferDesc *BuffDesc,GLContextState *CtxState,GLuint GLHandle,bool bIsDeviceInternal)

{
  GLenum GVar1;
  char (*Args_1) [15];
  char (*in_stack_ffffffffffffff38) [2];
  GLint BufferSize;
  GLenum err_1;
  GLenum BindTarget;
  string msg;
  BufferDesc local_58;
  
  local_58.ImmediateContextMask = BuffDesc->ImmediateContextMask;
  local_58.super_DeviceObjectAttribs.Name = (BuffDesc->super_DeviceObjectAttribs).Name;
  local_58.Size = BuffDesc->Size;
  local_58.BindFlags = BuffDesc->BindFlags;
  local_58.Usage = BuffDesc->Usage;
  local_58.CPUAccessFlags = BuffDesc->CPUAccessFlags;
  local_58.Mode = BuffDesc->Mode;
  local_58.MiscFlags = BuffDesc->MiscFlags;
  local_58.ElementByteStride = BuffDesc->ElementByteStride;
  local_58._28_4_ = *(undefined4 *)&BuffDesc->field_0x1c;
  GVar1 = GetBufferBindTarget(&local_58);
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = (ulong)msg._M_string_length._4_4_ << 0x20;
  Args_1 = (char (*) [15])0x1;
  BindTarget = GVar1;
  GLContextState::BindBuffer(CtxState,GVar1,(GLBufferObj *)&msg,true);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)&msg);
  (*__glewBindBuffer)(GVar1,GLHandle);
  BufferSize = glGetError();
  if (BufferSize != 0) {
    in_stack_ffffffffffffff38 = (char (*) [2])0x706f1d;
    LogError<false,char[29],unsigned_int,char[8],char[17],unsigned_int>
              (false,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xa8,(char (*) [29])"Failed to bind GL buffer to ",&BindTarget,
               (char (*) [8])0x706f1d,(char (*) [17])"\nGL Error Code: ",(uint *)&BufferSize);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    Args_1 = (char (*) [15])0xa8;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)&msg);
    GVar1 = BindTarget;
  }
  BufferSize = 0;
  (*__glewGetBufferParameteriv)(GVar1,0x8764,&BufferSize);
  err_1 = glGetError();
  if (err_1 != 0) {
    in_stack_ffffffffffffff38 = (char (*) [2])&err_1;
    LogError<false,char[32],char[17],unsigned_int>
              (false,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xac,(char (*) [32])"glGetBufferParameteriv() failed",
               (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff38);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    Args_1 = (char (*) [15])0xac;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xac);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (BufferSize < 1) {
    FormatString<char[26],char[15]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"BufferSize > 0",Args_1)
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xad);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (local_58.Size != (uint)BufferSize && local_58.Size != 0) {
    FormatString<char[42],unsigned_long,char[60],int,char[2]>
              (&msg,(Diligent *)"Buffer size specified by the BufferDesc (",
               (char (*) [42])&local_58.Size,
               (unsigned_long *)") does not match the size recovered from gl buffer object (",
               (char (*) [60])&BufferSize,(int *)0x801c00,in_stack_ffffffffffffff38);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xaf);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (0 < BufferSize) {
    local_58.Size = (Uint64)(uint)BufferSize;
  }
  (*__glewBindBuffer)(BindTarget,0);
  err_1 = glGetError();
  if (err_1 != 0) {
    LogError<false,char[27],char[17],unsigned_int>
              (false,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xb4,(char (*) [27])"Failed to unbind GL buffer",(char (*) [17])"\nGL Error Code: ",
               &err_1);
    FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBufferDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0xb4);
    std::__cxx11::string::~string((string *)&msg);
  }
  msg._M_dataplus._M_p = local_58.super_DeviceObjectAttribs.Name;
  msg._M_string_length = local_58.Size;
  msg.field_2._0_4_ = local_58.BindFlags;
  msg.field_2._4_1_ = local_58.Usage;
  msg.field_2._5_1_ = local_58.CPUAccessFlags;
  msg.field_2._6_1_ = local_58.Mode;
  msg.field_2._7_1_ = local_58.MiscFlags;
  msg.field_2._8_8_ = local_58._24_8_;
  BufferBase<Diligent::EngineGLImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineGLImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pDeviceGL,(BufferDesc *)&msg,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_BufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferGL>.super_RefCountedObject<Diligent::IBufferGL>.super_IBufferGL.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00a58cc8;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlBuffer,true,(GLBufferObjCreateReleaseHelper)GLHandle);
  GVar1 = GetBufferBindTarget(&(this->super_BufferBase<Diligent::EngineGLImplTraits>).
                               super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                               .m_Desc);
  this->m_BindTarget = GVar1;
  GVar1 = UsageToGLUsage(BuffDesc);
  this->m_GLUsageHint = GVar1;
  (this->super_BufferBase<Diligent::EngineGLImplTraits>).m_MemoryProperties =
       MEMORY_PROPERTY_HOST_COHERENT;
  return;
}

Assistant:

BufferGLImpl::BufferGLImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           const BufferDesc&          BuffDesc,
                           GLContextState&            CtxState,
                           GLuint                     GLHandle,
                           bool                       bIsDeviceInternal) :
    // clang-format off
    TBufferBase
    {
        pRefCounters,
        BuffViewObjMemAllocator,
        pDeviceGL,
        GetBufferDescFromGLHandle(CtxState, BuffDesc, GLHandle),
        bIsDeviceInternal
    },
    // Attach to external buffer handle
    m_GlBuffer    {true, GLObjectWrappers::GLBufferObjCreateReleaseHelper(GLHandle)},
    m_BindTarget  {GetBufferBindTarget(m_Desc)},
    m_GLUsageHint {UsageToGLUsage(BuffDesc)   }
// clang-format on
{
    m_MemoryProperties = MEMORY_PROPERTY_HOST_COHERENT;
}